

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<double,std::allocator<double>>,double>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               vector<double,_std::allocator<double>_> *v)

{
  BasicStringRef<char> value;
  bool bVar1;
  const_iterator cVar2;
  const_iterator this;
  reference value_00;
  size_t in_RSI;
  BasicWriter<char> *in_RDI;
  double *el;
  const_iterator __end0;
  const_iterator __begin0;
  vector<double,_std::allocator<double>_> *__range2;
  int n;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  BasicWriter<char> *in_stack_ffffffffffffffb0;
  int local_14;
  
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
  local_14 = -1;
  cVar2 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  this = std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)
                    CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    if (!bVar1) break;
    value_00 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)&stack0xffffffffffffffd8);
    local_14 = local_14 + 1;
    if (local_14 != 0) {
      in_stack_ffffffffffffffb0 = in_RDI;
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_RDI,
                 (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      value.size_ = in_RSI;
      value.data_ = (char *)cVar2._M_current;
      fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)this._M_current,value);
    }
    fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)this._M_current,(double)value_00);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               &stack0xffffffffffffffd8);
  }
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
  return;
}

Assistant:

void WriteModelItemParameters(
    Writer& wrt, const Vec& v) {
  wrt << '[';
  int n=-1;
  for (const auto& el: v) {
    if (++n)
      wrt << ", ";
    wrt << el;
  }
  wrt << ']';
}